

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_1::AggregateErrorCollector::AddError
          (AggregateErrorCollector *this,int line,int column,string *message)

{
  if ((this->error_)._M_string_length != 0) {
    std::__cxx11::string::append((char *)&this->error_);
  }
  std::__cxx11::string::append((string *)&this->error_);
  return;
}

Assistant:

virtual void AddError(int line, int column, const string& message) {
    if (!error_.empty()) {
      error_ += "; ";
    }
    error_ += message;
  }